

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O2

void __thiscall GF2::MP<45UL,_GF2::MOGrlex<45UL>_>::Geobucket<4UL>::NewBucket(Geobucket<4UL> *this)

{
  long lVar1;
  unsigned_long local_18;
  
  lVar1 = (long)(this->_buckets).
                super__Vector_base<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>,_std::allocator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->_buckets).
                super__Vector_base<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>,_std::allocator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  std::
  vector<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>,_std::allocator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_>_>::
  resize(&this->_buckets,(lVar1 >> 5) + 1);
  local_18 = *(long *)((long)(this->_maxsizes).
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start + (lVar1 >> 2) + -8) << 2;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&this->_maxsizes,&local_18);
  return;
}

Assistant:

void NewBucket()
		{
			size_t size = (size_t)_buckets.size();
			_buckets.resize(size + 1);
			_buckets[size].SetOrder(_buckets[size - 1].GetOrder());
			_maxsizes.push_back(_d * _maxsizes[size - 1]);
		}